

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_striped_avx2_256_8
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  parasail_profile_t *profile_00;
  undefined4 in_register_00000084;
  undefined8 uVar1;
  parasail_matrix_t *in_stack_00000090;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  int in_stack_00000604;
  int in_stack_00000608;
  int in_stack_0000060c;
  char *in_stack_00000610;
  parasail_profile_t *in_stack_00000618;
  parasail_result_t *result;
  parasail_profile_t *profile;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  uVar1 = CONCAT44(in_register_00000084,open);
  if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_avx2_256_8","s2",uVar1,gap,0
            ,0);
    s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_avx2_256_8","s2Len",
            uVar1,gap,0,0);
    s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_avx2_256_8","open",
            uVar1,gap,0,0);
    s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_striped_avx2_256_8","gap",uVar1
            ,gap,0,0);
    s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_avx2_256_8","matrix",uVar1,
            gap,0,0);
    s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sw_stats_table_striped_avx2_256_8");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_striped_avx2_256_8","s1",uVar1,
                gap,0,0);
        return (parasail_result_t *)0x0;
      }
      if (s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_striped_avx2_256_8","s1Len",
                uVar1,gap,0,0);
        return (parasail_result_t *)0x0;
      }
    }
    profile_00 = parasail_profile_create_stats_avx_256_8
                           (in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
    if (profile_00 == (parasail_profile_t *)0x0) {
      s1_local = (char *)0x0;
    }
    else {
      s1_local = (char *)parasail_sw_stats_table_striped_profile_avx2_256_8
                                   (in_stack_00000618,in_stack_00000610,in_stack_0000060c,
                                    in_stack_00000608,in_stack_00000604);
      parasail_profile_free(profile_00);
    }
  }
  return (parasail_result_t *)s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_profile_t *profile = NULL;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(s1);
    }
    else {
        PARASAIL_CHECK_NULL(s1);
        PARASAIL_CHECK_GT0(s1Len);
    }

    /* initialize local variables */
    profile = parasail_profile_create_stats_avx_256_8(s1, s1Len, matrix);
    if (!profile) return NULL;
    result = INAME(profile, s2, s2Len, open, gap);

    parasail_profile_free(profile);

    return result;
}